

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void Assimp::ZipArchiveIOSystem::Implement::SimplifyFilename(string *filename)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  size_t prevpos;
  size_t relsize;
  allocator<char> local_19;
  ulong local_18;
  size_t pos;
  string *filename_local;
  
  pos = (size_t)filename;
  ReplaceAllChar(filename,'\\','/');
  local_18 = std::__cxx11::string::find_first_not_of((char *)pos,0xbec2d9);
  if (local_18 != 0) {
    std::__cxx11::string::erase(pos,0);
  }
  if (SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_);
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_,"/../",
                 &local_19);
      std::allocator<char>::~allocator(&local_19);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SimplifyFilename(std::__cxx11::string&)::relative_abi_cxx11_);
    }
  }
  std::__cxx11::string::size();
  local_18 = std::__cxx11::string::find((string *)pos,0x1023278);
  while (local_18 != 0xffffffffffffffff) {
    uVar3 = std::__cxx11::string::rfind((char)pos,0x2f);
    sVar1 = pos;
    if (uVar3 == local_18) {
      std::__cxx11::string::size();
      std::__cxx11::string::erase(sVar1,0);
    }
    else {
      std::__cxx11::string::erase(pos,uVar3);
    }
    local_18 = std::__cxx11::string::find((string *)pos,0x1023278);
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::SimplifyFilename(std::string& filename)
    {
        ReplaceAllChar(filename, '\\', '/');

        // Remove all . and / from the beginning of the path
        size_t pos = filename.find_first_not_of("./");
        if (pos != 0)
            filename.erase(0, pos);

        // Simplify "my/folder/../file.png" constructions, if any
        static const std::string relative("/../");
        const size_t relsize = relative.size() - 1;
        pos = filename.find(relative);
        while (pos != std::string::npos)
        {
            // Previous slash
            size_t prevpos = filename.rfind('/', pos - 1);
            if (prevpos == pos)
                filename.erase(0, pos + relative.size());
            else
                filename.erase(prevpos, pos + relsize - prevpos);

            pos = filename.find(relative);
        }
    }